

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::read_bad_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pMVar4;
  element_type *peVar5;
  element_type *this_00;
  qpdf_offset_t qVar6;
  long lVar7;
  char *pcVar8;
  longlong lVar9;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  QPDFExc local_130;
  string local_b0 [8];
  string f2_str;
  string f1_str;
  char *pcStack_58;
  bool invalid;
  char *p;
  string line;
  char *type_local;
  int *f2_local;
  qpdf_offset_t *f1_local;
  QPDF *this_local;
  
  line.field_2._8_8_ = type;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar4->file);
  qVar6 = InputSource::getLastOffset(this_00);
  (*peVar5->_vptr_InputSource[5])(peVar5,qVar6,0);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  InputSource::readLine_abi_cxx11_((string *)&p,peVar5,0x1e);
  pcStack_58 = (char *)std::__cxx11::string::data();
  bVar1 = false;
  while (bVar2 = ::qpdf::util::is_space(*pcStack_58), bVar2) {
    pcStack_58 = pcStack_58 + 1;
    QTC::TC("qpdf","QPDF ignore first space in xref entry",0);
    bVar1 = true;
  }
  bVar2 = ::qpdf::util::is_digit(*pcStack_58);
  if (bVar2) {
    std::__cxx11::string::string((string *)(f2_str.field_2._M_local_buf + 8));
    while (bVar2 = ::qpdf::util::is_digit(*pcStack_58), bVar2) {
      pcStack_58 = pcStack_58 + 1;
      std::__cxx11::string::append((ulong)((long)&f2_str.field_2 + 8),'\x01');
    }
    bVar2 = ::qpdf::util::is_space(*pcStack_58);
    if (bVar2) {
      bVar2 = ::qpdf::util::is_space(pcStack_58[1]);
      if (bVar2) {
        QTC::TC("qpdf","QPDF ignore first extra space in xref entry",0);
        bVar1 = true;
      }
      while (bVar2 = ::qpdf::util::is_space(*pcStack_58), bVar2) {
        pcStack_58 = pcStack_58 + 1;
      }
      bVar2 = ::qpdf::util::is_digit(*pcStack_58);
      if (bVar2) {
        std::__cxx11::string::string(local_b0);
        while (bVar2 = ::qpdf::util::is_digit(*pcStack_58), bVar2) {
          pcStack_58 = pcStack_58 + 1;
          std::__cxx11::string::append((ulong)local_b0,'\x01');
        }
        bVar2 = ::qpdf::util::is_space(*pcStack_58);
        if (bVar2) {
          bVar2 = ::qpdf::util::is_space(pcStack_58[1]);
          if (bVar2) {
            QTC::TC("qpdf","QPDF ignore second extra space in xref entry",0);
            bVar1 = true;
          }
          while (bVar2 = ::qpdf::util::is_space(*pcStack_58), bVar2) {
            pcStack_58 = pcStack_58 + 1;
          }
          if ((*pcStack_58 == 'f') || (*pcStack_58 == 'n')) {
            *(char *)line.field_2._8_8_ = *pcStack_58;
            lVar7 = std::__cxx11::string::length();
            if ((lVar7 != 10) || (lVar7 = std::__cxx11::string::length(), lVar7 != 5)) {
              QTC::TC("qpdf","QPDF ignore length error xref entry",0);
              bVar1 = true;
            }
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_150,"xref table",&local_151);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_178,"accepting invalid xref table entry",&local_179);
              damagedPDF(&local_130,this,&local_150,&local_178);
              warn(this,&local_130);
              QPDFExc::~QPDFExc(&local_130);
              std::__cxx11::string::~string((string *)&local_178);
              std::allocator<char>::~allocator(&local_179);
              std::__cxx11::string::~string((string *)&local_150);
              std::allocator<char>::~allocator(&local_151);
            }
            pcVar8 = (char *)std::__cxx11::string::c_str();
            lVar9 = QUtil::string_to_ll(pcVar8);
            *f1 = lVar9;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar3 = QUtil::string_to_int(pcVar8);
            *f2 = iVar3;
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
        std::__cxx11::string::~string(local_b0);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)(f2_str.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)&p);
  return this_local._7_1_;
}

Assistant:

bool
QPDF::read_bad_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    // Reposition after initial read attempt and reread.
    m->file->seek(m->file->getLastOffset(), SEEK_SET);
    auto line = m->file->readLine(30);

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.data();

    // Skip zero or more spaces. There aren't supposed to be any.
    bool invalid = false;
    while (util::is_space(*p)) {
        ++p;
        QTC::TC("qpdf", "QPDF ignore first space in xref entry");
        invalid = true;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f1_str;
    while (util::is_digit(*p)) {
        f1_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore first extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f2_str;
    while (util::is_digit(*p)) {
        f2_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore second extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    if ((*p == 'f') || (*p == 'n')) {
        type = *p;
    } else {
        return false;
    }
    if ((f1_str.length() != 10) || (f2_str.length() != 5)) {
        QTC::TC("qpdf", "QPDF ignore length error xref entry");
        invalid = true;
    }

    if (invalid) {
        warn(damagedPDF("xref table", "accepting invalid xref table entry"));
    }

    f1 = QUtil::string_to_ll(f1_str.c_str());
    f2 = QUtil::string_to_int(f2_str.c_str());

    return true;
}